

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cpp
# Opt level: O0

bool uci::parse_command(string *input)

{
  byte bVar1;
  undefined4 uVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  int iVar6;
  istream *piVar7;
  iterator __first;
  iterator __last;
  iterator __result;
  U64 UVar8;
  Searchthread *t_00;
  Move *pMVar9;
  Move *pMVar10;
  char *pcVar11;
  pointer poVar12;
  int *piVar13;
  size_t sVar14;
  size_t sVar15;
  Move *pMVar16;
  ostream *poVar17;
  Move *m;
  Move *m_00;
  float fVar18;
  char *local_1428;
  char *local_1420;
  char *local_1418;
  char *local_1410;
  char *local_1408;
  char *local_1400;
  byte local_11ba;
  string local_1168;
  int local_1144;
  undefined1 local_1140 [4];
  int i_2;
  Movegen mvs_2;
  int iStack_dc0;
  bool silent;
  int local_dbc;
  undefined1 local_db8 [4];
  int numThreads;
  limits lims;
  allocator<char> local_d81;
  Movetype t;
  string ps;
  string tmp_1;
  int i_1;
  bool isok;
  Movegen mvs_1;
  undefined1 local_9b8 [4];
  int score;
  int local_998;
  Move local_993;
  int i;
  Move move;
  Movegen mvs;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  int local_574;
  istringstream local_570 [4];
  int sz;
  istringstream fen_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  allocator<char> local_3a9;
  undefined1 local_3a8 [8];
  string sfen;
  istringstream fen;
  undefined1 local_208 [8];
  string tmp;
  bool local_1b1;
  undefined1 local_1b0 [7];
  bool running;
  string cmd;
  istringstream instream;
  string *input_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(cmd.field_2._M_local_buf + 8),(string *)input,_S_in);
  std::__cxx11::string::string((string *)local_1b0);
  local_1b1 = true;
LAB_0015fc87:
  piVar7 = (istream *)
           std::istream::operator>>((istream *)(cmd.field_2._M_local_buf + 8),std::skipws);
  piVar7 = std::operator>>(piVar7,(string *)local_1b0);
  bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
  if (!bVar3) goto LAB_00161fe3;
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0
                     );
  __result = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1b0);
  tmp.field_2._8_8_ =
       std::
       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                 ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )__first._M_current,
                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )__last._M_current,
                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )__result._M_current,tolower);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b0,"position");
  if (bVar3) {
    piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (bVar3) {
      std::__cxx11::string::string((string *)local_208);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1b0,"startpos");
      if (bVar3) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_208);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)(sfen.field_2._M_local_buf + 8),(string *)&START_FEN_abi_cxx11_,
                   _S_in);
        position::setup(&uci_pos,(istringstream *)(sfen.field_2._M_local_buf + 8));
        load_position((string *)local_208);
        std::__cxx11::istringstream::~istringstream
                  ((istringstream *)(sfen.field_2._M_local_buf + 8));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,"",&local_3a9);
        std::allocator<char>::~allocator(&local_3a9);
        while( true ) {
          piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
          bVar3 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
          local_11ba = 0;
          if (bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1b0,"moves");
            local_11ba = bVar3 ^ 0xff;
          }
          if ((local_11ba & 1) == 0) break;
          std::operator+(&local_3d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0," ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     &local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
        }
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_208);
        std::operator+(&local_3f0,"moves ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   &local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::istringstream::istringstream(local_570,(string *)local_3a8,_S_in);
        position::setup(&uci_pos,(istringstream *)local_570);
        load_position((string *)local_208);
        std::__cxx11::istringstream::~istringstream(local_570);
        std::__cxx11::string::~string((string *)local_3a8);
      }
      std::__cxx11::string::~string((string *)local_208);
      goto LAB_0015fc87;
    }
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b0,"setoption");
  if (bVar3) {
    piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar3) goto LAB_0016073f;
    piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar3) goto LAB_0016073f;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0,"hash");
    if (bVar3) {
      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (bVar3) {
        piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
        if (bVar3) {
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0);
          local_574 = atoi(pcVar11);
          poVar12 = std::unique_ptr<options,_std::default_delete<options>_>::operator->(&opts);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_598,"hashsize",&local_599);
          options::set<int>(poVar12,&local_598,local_574);
          std::__cxx11::string::~string((string *)&local_598);
          std::allocator<char>::~allocator(&local_599);
          hash_table::resize(&ttable,(long)local_574);
          goto LAB_00161fe3;
        }
      }
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0,"clear");
    if (bVar3) {
      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if ((bVar3) &&
         (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1b0,"hash"), bVar3)) {
        hash_table::clear(&ttable);
      }
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0,"threads");
    if (bVar3) {
      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (bVar3) {
        piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
        if (bVar3) {
          poVar12 = std::unique_ptr<options,_std::default_delete<options>_>::operator->(&opts);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c0,"threads",&local_5c1);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0);
          iVar5 = atoi(pcVar11);
          options::set<int>(poVar12,&local_5c0,iVar5);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::allocator<char>::~allocator(&local_5c1);
          goto LAB_00161fe3;
        }
      }
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0,"multipv");
    if (bVar3) {
      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (bVar3) {
        piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
        if (bVar3) {
          poVar12 = std::unique_ptr<options,_std::default_delete<options>_>::operator->(&opts);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e8,"multipv",&local_5e9);
          pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0);
          iVar5 = atoi(pcVar11);
          options::set<int>(poVar12,&local_5e8,iVar5);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::allocator<char>::~allocator(&local_5e9);
LAB_00161fe3:
          lims.depth = 1;
          std::__cxx11::string::~string((string *)local_1b0);
          std::__cxx11::istringstream::~istringstream
                    ((istringstream *)(cmd.field_2._M_local_buf + 8));
          return local_1b1;
        }
      }
    }
  }
  else {
LAB_0016073f:
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0,"d");
    if (bVar3) {
      position::print(&uci_pos);
      poVar17 = std::operator<<((ostream *)&std::cout,"position hash key: ");
      UVar8 = position::key(&uci_pos);
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,UVar8);
      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
      poVar17 = std::operator<<((ostream *)&std::cout,"fen: ");
      position::to_fen_abi_cxx11_(&local_610,&uci_pos);
      poVar17 = std::operator<<(poVar17,(string *)&local_610);
      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_610);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1b0,"eval");
      if (bVar3) {
        position::print(&uci_pos);
        poVar17 = std::operator<<((ostream *)&std::cout,"position hash key: ");
        UVar8 = position::key(&uci_pos);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,UVar8);
        std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
        poVar17 = std::operator<<((ostream *)&std::cout,"evaluation: ");
        mvs.can_castle_ks = false;
        mvs.can_castle_qs = false;
        mvs._886_2_ = 0;
        t_00 = Threadpool<Searchthread>::operator[](&SearchThreads,(int *)&mvs.can_castle_ks);
        mvs.eps = 0xbf800000;
        fVar18 = eval::evaluate(&uci_pos,t_00,(float *)&mvs.eps);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,fVar18);
        std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1b0,"undo");
        if (!bVar3) {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1b0,"fdepth");
          if (bVar3) {
            piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
            bVar3 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
            if (bVar3) {
              pcVar11 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b0);
              uci_pos.params.fixed_depth = atoi(pcVar11);
              poVar17 = std::operator<<((ostream *)&std::cout,"fixed depth search: ");
              poVar17 = (ostream *)std::ostream::operator<<(poVar17,uci_pos.params.fixed_depth);
              std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
              goto LAB_0015fc87;
            }
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1b0,"see");
          if (bVar3) {
            piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
            bVar3 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
            if (bVar3) {
              Movegen::Movegen((Movegen *)&i,&uci_pos);
              Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)&i);
              Move::Move(&local_993);
              for (local_998 = 0; iVar5 = local_998, iVar6 = Movegen::size((Movegen *)&i),
                  iVar5 < iVar6; local_998 = local_998 + 1) {
                pMVar16 = Movegen::operator[]((Movegen *)&i,&local_998);
                bVar3 = position::is_legal(&uci_pos,pMVar16);
                if (bVar3) {
                  pMVar16 = Movegen::operator[]((Movegen *)&i,&local_998);
                  move_to_string_abi_cxx11_((string *)local_9b8,(uci *)pMVar16,m);
                  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_9b8,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                  std::__cxx11::string::~string((string *)local_9b8);
                  if (_Var4) {
                    pMVar16 = Movegen::operator[]((Movegen *)&i,&local_998);
                    Move::operator=(&local_993,pMVar16);
                    break;
                  }
                }
              }
              if (local_993.type == '\x11') {
                poVar17 = std::operator<<((ostream *)&std::cout," (dbg) See : error, illegal move.")
                ;
                std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
              }
              else {
                mvs_1._884_4_ = position::see_move(&uci_pos,&local_993);
                poVar17 = std::operator<<((ostream *)&std::cout,"See score:  ");
                poVar17 = (ostream *)std::ostream::operator<<(poVar17,mvs_1._884_4_);
                std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
              }
              Movegen::~Movegen((Movegen *)&i);
              goto LAB_0015fc87;
            }
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1b0,"domove");
          if (bVar3) {
            piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),(string *)local_1b0);
            bVar3 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
            if (bVar3) {
              Movegen::Movegen((Movegen *)&i_1,&uci_pos);
              tmp_1.field_2._M_local_buf[0xf] = '\0';
              Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)&i_1);
              for (tmp_1.field_2._8_4_ = 0; uVar2 = tmp_1.field_2._8_4_,
                  iVar5 = Movegen::size((Movegen *)&i_1), (int)uVar2 < iVar5;
                  tmp_1.field_2._8_4_ = tmp_1.field_2._8_4_ + 1) {
                pMVar16 = Movegen::operator[]((Movegen *)&i_1,
                                              (int *)(tmp_1.field_2._M_local_buf + 8));
                bVar3 = position::is_legal(&uci_pos,pMVar16);
                if (bVar3) {
                  pMVar16 = Movegen::operator[]((Movegen *)&i_1,
                                                (int *)(tmp_1.field_2._M_local_buf + 8));
                  bVar1 = pMVar16->f;
                  pMVar16 = Movegen::operator[]((Movegen *)&i_1,
                                                (int *)(tmp_1.field_2._M_local_buf + 8));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&ps.field_2 + 8),SanSquares_abi_cxx11_ + bVar1,
                                 SanSquares_abi_cxx11_ + pMVar16->t);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>((string *)&t,"",&local_d81);
                  std::allocator<char>::~allocator(&local_d81);
                  pMVar16 = Movegen::operator[]((Movegen *)&i_1,
                                                (int *)(tmp_1.field_2._M_local_buf + 8));
                  bVar1 = pMVar16->type;
                  if (bVar1 < 4) {
                    if (bVar1 == 0) {
                      local_1400 = "q";
                    }
                    else {
                      if (bVar1 == 1) {
                        local_1408 = "r";
                      }
                      else {
                        if (bVar1 == 2) {
                          local_1410 = "b";
                        }
                        else {
                          local_1410 = "n";
                        }
                        local_1408 = local_1410;
                      }
                      local_1400 = local_1408;
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&t,local_1400);
                  }
                  else if ((3 < bVar1) && (bVar1 < 8)) {
                    if (bVar1 == 4) {
                      local_1418 = "q";
                    }
                    else {
                      if (bVar1 == 5) {
                        local_1420 = "r";
                      }
                      else {
                        if (bVar1 == 6) {
                          local_1428 = "b";
                        }
                        else {
                          local_1428 = "n";
                        }
                        local_1420 = local_1428;
                      }
                      local_1418 = local_1420;
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&t,local_1418);
                  }
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&ps.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t
                            );
                  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&ps.field_2 + 8),
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                  if (_Var4) {
                    pMVar16 = Movegen::operator[]((Movegen *)&i_1,
                                                  (int *)(tmp_1.field_2._M_local_buf + 8));
                    pMVar9 = Movegen::operator[]((Movegen *)&i_1,
                                                 (int *)(tmp_1.field_2._M_local_buf + 8));
                    pMVar10 = Movegen::operator[]((Movegen *)&i_1,
                                                  (int *)(tmp_1.field_2._M_local_buf + 8));
                    lims._36_4_ = ZEXT14(pMVar10->type);
                    Move::set(&dbgmove,&pMVar16->f,&pMVar9->t,(Movetype *)&lims.infinite);
                    tmp_1.field_2._M_local_buf[0xf] = '\x01';
                    lims.depth = 9;
                  }
                  else {
                    lims.depth = 0;
                  }
                  std::__cxx11::string::~string((string *)&t);
                  std::__cxx11::string::~string((string *)(ps.field_2._M_local_buf + 8));
                  if (lims.depth != 0) break;
                }
              }
              if ((tmp_1.field_2._M_local_buf[0xf] & 1U) == 0) {
                poVar17 = std::operator<<((ostream *)&std::cout,(string *)local_1b0);
                poVar17 = std::operator<<(poVar17," is not a legal move");
                std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar17 = std::operator<<((ostream *)&std::cout,"doing mv ");
                std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                position::do_move(&uci_pos,&dbgmove);
              }
              Movegen::~Movegen((Movegen *)&i_1);
              goto LAB_0015fc87;
            }
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1b0,"debug");
          if (bVar3) {
            uci_pos.debug_search = (bool)(~uci_pos.debug_search & 1);
            poVar17 = std::operator<<((ostream *)&std::cout,"debugging set to: ");
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,(bool)(uci_pos.debug_search & 1));
            std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1b0,"isready");
            if (bVar3) {
              hash_table::clear(&ttable);
              poVar17 = std::operator<<((ostream *)&std::cout,"readyok");
              std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
            }
            else {
              bVar3 = std::atomic::operator_cast_to_bool((atomic *)&Search::searching);
              if ((!bVar3) &&
                 (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0,"go"), bVar3)) {
                memset(local_db8,0,0x28);
LAB_00161497:
                do {
                  piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                           (string *)local_1b0);
                  bVar3 = std::ios::operator_cast_to_bool
                                    ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                  if (!bVar3) goto LAB_00161a84;
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0,"wtime");
                  if (!bVar3) {
LAB_0016156c:
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"btime");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        numThreads = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"winc");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        lims.wtime = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"binc");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        lims.btime = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"movestogo");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        lims.winc = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"nodes");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        lims.binc = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"movetime");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        lims.movestogo = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"mate");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        lims.nodes = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"depth");
                    if (bVar3) {
                      piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                               (string *)local_1b0);
                      bVar3 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        lims.movetime = atoi(pcVar11);
                        goto LAB_00161497;
                      }
                    }
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"infinite");
                    if (bVar3) {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1b0,"infinite");
                      lims.mate._0_1_ = -bVar3 & 1;
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1b0,"ponder");
                      if (bVar3) {
                        pcVar11 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0);
                        iVar5 = atoi(pcVar11);
                        lims.mate._1_1_ = iVar5 != 0;
                      }
                    }
                    goto LAB_00161497;
                  }
                  piVar7 = std::operator>>((istream *)(cmd.field_2._M_local_buf + 8),
                                           (string *)local_1b0);
                  bVar3 = std::ios::operator_cast_to_bool
                                    ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                  if (!bVar3) goto LAB_0016156c;
                  pcVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1b0);
                  local_db8 = (undefined1  [4])atoi(pcVar11);
                } while( true );
              }
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1b0,"stop");
              if (bVar3) {
                UCI_SIGNALS.stop = true;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1b0,"moves");
                if (bVar3) {
                  Movegen::Movegen((Movegen *)local_1140,&uci_pos);
                  Movegen::generate<(Movetype)14,(Piece)6>((Movegen *)local_1140);
                  for (local_1144 = 0; iVar5 = local_1144,
                      iVar6 = Movegen::size((Movegen *)local_1140), iVar5 < iVar6;
                      local_1144 = local_1144 + 1) {
                    pMVar16 = Movegen::operator[]((Movegen *)local_1140,&local_1144);
                    bVar3 = position::is_legal(&uci_pos,pMVar16);
                    if (bVar3) {
                      pMVar16 = Movegen::operator[]((Movegen *)local_1140,&local_1144);
                      move_to_string_abi_cxx11_(&local_1168,(uci *)pMVar16,m_00);
                      poVar17 = std::operator<<((ostream *)&std::cout,(string *)&local_1168);
                      std::operator<<(poVar17," ");
                      std::__cxx11::string::~string((string *)&local_1168);
                    }
                  }
                  std::ostream::operator<<
                            ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
                  Movegen::~Movegen((Movegen *)local_1140);
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0,"ucinewgame");
                  if (bVar3) {
                    hash_table::clear(&ttable);
                    position::clear(&uci_pos);
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"uci");
                    if (bVar3) {
                      hash_table::clear(&ttable);
                      position::clear(&uci_pos);
                      poVar17 = std::operator<<((ostream *)&std::cout,"id name haVoc");
                      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                      poVar17 = std::operator<<((ostream *)&std::cout,"id author M.Glatzmaier");
                      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                      poVar17 = std::operator<<((ostream *)&std::cout,
                                                "option name Threads type spin default 1 min 1 max 1024"
                                               );
                      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                      poVar17 = std::operator<<((ostream *)&std::cout,
                                                "option name Hash type spin default 1024 min 1 max 33554432"
                                               );
                      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                      poVar17 = std::operator<<((ostream *)&std::cout,
                                                "option name MultiPV type spin default 1 min 1 max 4"
                                               );
                      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                      poVar17 = std::operator<<((ostream *)&std::cout,"uciok");
                      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1b0,"exit");
                      if ((bVar3) ||
                         (bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1b0,"quit"), bVar3)) {
                        local_1b1 = false;
                        goto LAB_00161fe3;
                      }
                      poVar17 = std::operator<<((ostream *)&std::cout,"unknown command: ");
                      poVar17 = std::operator<<(poVar17,(string *)local_1b0);
                      std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
                    }
                  }
                }
              }
            }
          }
          goto LAB_0015fc87;
        }
        position::undo_move(&uci_pos,&dbgmove);
      }
    }
  }
  goto LAB_0015fc87;
LAB_00161a84:
  poVar12 = std::unique_ptr<options,_std::default_delete<options>_>::operator->(&opts);
  iStack_dc0 = options::value<int>(poVar12,"threads");
  mvs_2.can_castle_ks = true;
  mvs_2.can_castle_qs = false;
  mvs_2._886_2_ = 0;
  piVar13 = std::max<int>(&stack0xfffffffffffff240,(int *)&mvs_2.can_castle_ks);
  local_dbc = *piVar13;
  sVar14 = (size_t)local_dbc;
  sVar15 = Threadpool<Searchthread>::num_workers(&SearchThreads);
  if (sVar14 != sVar15) {
    Threadpool<Searchthread>::init(&SearchThreads,(EVP_PKEY_CTX *)&local_dbc);
  }
  mvs_2.eps._3_1_ = A1 >> 0x18;
  Threadpool<Workerthread>::enqueue<void(&)(position&,limits&,bool),position&,limits&,bool&>
            (&worker,Search::start,&uci_pos,(limits *)local_db8,(bool *)((long)&mvs_2.eps + 3));
  goto LAB_0015fc87;
}

Assistant:

bool uci::parse_command(const std::string& input) {
	std::istringstream instream(input);
	std::string cmd;
	bool running = true;

	while (instream >> std::skipws >> cmd) {
		std::transform(cmd.begin(), cmd.end(), cmd.begin(), ::tolower);

		if (cmd == "position" && instream >> cmd) {

			std::string tmp;
			if (cmd == "startpos") {
				getline(instream, tmp);
				std::istringstream fen(START_FEN);
				uci_pos.setup(fen);
				load_position(tmp);
			}
			else {
				std::string sfen = "";
				while ((instream >> cmd) && cmd != "moves") sfen += cmd + " ";
				getline(instream, tmp);
				tmp = "moves " + tmp;
				std::istringstream fen(sfen);
				uci_pos.setup(fen);
				load_position(tmp);
			}
		}
		else if (cmd == "setoption" && instream >> cmd && instream >> cmd)
		{
			if (cmd == "hash" && instream >> cmd && instream >> cmd)
			{
				auto sz = atoi(cmd.c_str());
				opts->set("hashsize", sz);
				ttable.resize(sz);
				break;
			}
			if (cmd == "clear" && instream >> cmd)
			{
				if (cmd == "hash")
					ttable.clear();
			}
			if (cmd == "threads" && instream >> cmd && instream >> cmd)
			{
				opts->set("threads", atoi(cmd.c_str()));
				break;
			}
			if (cmd == "multipv" && instream >> cmd && instream >> cmd)
			{
				opts->set("multipv", atoi(cmd.c_str()));
				break;
			}
		}
		else if (cmd == "d") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "fen: " << uci_pos.to_fen() << std::endl;
		}
		else if (cmd == "eval") {
			uci_pos.print();
			std::cout << "position hash key: " << uci_pos.key() << std::endl;
			std::cout << "evaluation: " << eval::evaluate(uci_pos, *SearchThreads[0], -1) << std::endl;
		}
		else if (cmd == "undo") {
			uci_pos.undo_move(dbgmove);
		}
		else if (cmd == "fdepth" && instream >> cmd) {
			uci_pos.params.fixed_depth = atoi(cmd.c_str());
			std::cout << "fixed depth search: " << uci_pos.params.fixed_depth << std::endl;
		}

		else if (cmd == "see" && instream >> cmd) {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			Move move;


			for (int i = 0; i < mvs.size(); ++i) {

				if (!uci_pos.is_legal(mvs[i])) continue;

				if (move_to_string(mvs[i]) == cmd) {
					move = mvs[i];
					break;
				}

			}

			if (move.type != Movetype::no_type) {
				int score = uci_pos.see_move(move);
				std::cout << "See score:  " << score << std::endl;
			}
			else std::cout << " (dbg) See : error, illegal move." << std::endl;
		}
		//else if (cmd == "evaltune") {
		//	auto& tm = haVoc::Tuningmanager::instance();
		//	tm.tune_evaluation();
		//}
		else if (cmd == "domove" && instream >> cmd) {
			Movegen mvs(uci_pos);
			bool isok = false;
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) continue;
				std::string tmp = SanSquares[mvs[i].f] + SanSquares[mvs[i].t];
				std::string ps = "";
				Movetype t = Movetype(mvs[i].type);

				if (t >= 0 && t < capture_promotion_q) {
					ps = (t == 0 ? "q" :
						t == 1 ? "r" :
						t == 2 ? "b" : "n");
				}
				else if (t >= capture_promotion_q && t < castle_ks) {
					ps = (t == 4 ? "q" :
						t == 5 ? "r" :
						t == 6 ? "b" : "n");
				}
				tmp += ps;

				if (tmp == cmd) {
					dbgmove.set(mvs[i].f, mvs[i].t, Movetype(mvs[i].type));
					isok = true;
					break;
				}
			}
			if (isok) {
				std::cout << "doing mv " << std::endl;
				uci_pos.do_move(dbgmove);
			}
			else std::cout << cmd << " is not a legal move" << std::endl;
		}
		else if (cmd == "debug") {
			uci_pos.debug_search = !uci_pos.debug_search;
			std::cout << "debugging set to: " << uci_pos.debug_search << std::endl;
		}

		// game specific uci commands (refactor?)
		else if (cmd == "isready") {
			ttable.clear();
			std::cout << "readyok" << std::endl;
		}
		else if (!Search::searching && cmd == "go") {
			limits lims;
			memset(&lims, 0, sizeof(limits));

			while (instream >> cmd)
			{
				if (cmd == "wtime" && instream >> cmd) lims.wtime = atoi(cmd.c_str());
				else if (cmd == "btime" && instream >> cmd) lims.btime = atoi(cmd.c_str());
				else if (cmd == "winc" && instream >> cmd) lims.winc = atoi(cmd.c_str());
				else if (cmd == "binc" && instream >> cmd) lims.binc = atoi(cmd.c_str());
				else if (cmd == "movestogo" && instream >> cmd) lims.movestogo = atoi(cmd.c_str());
				else if (cmd == "nodes" && instream >> cmd) lims.nodes = atoi(cmd.c_str());
				else if (cmd == "movetime" && instream >> cmd) lims.movetime = atoi(cmd.c_str());
				else if (cmd == "mate" && instream >> cmd) lims.mate = atoi(cmd.c_str());
				else if (cmd == "depth" && instream >> cmd) lims.depth = atoi(cmd.c_str());
				else if (cmd == "infinite") lims.infinite = (cmd == "infinite" ? true : false);
				else if (cmd == "ponder") lims.ponder = atoi(cmd.c_str());
			}

			// Set search threads
			int numThreads = std::max(opts->value<int>("threads"), 1);
			if (numThreads != SearchThreads.num_workers())
				SearchThreads.init(numThreads);

			bool silent = false;
			worker.enqueue(Search::start, uci_pos, lims, silent);
		}
		else if (cmd == "stop") {
			UCI_SIGNALS.stop = true;
		}
		else if (cmd == "moves") {
			Movegen mvs(uci_pos);
			mvs.generate<pseudo_legal, pieces>();
			for (int i = 0; i < mvs.size(); ++i) {
				if (!uci_pos.is_legal(mvs[i])) 
					continue;
				std::cout << move_to_string(mvs[i]) << " ";
			}
			std::cout << std::endl;
		}
		else if (cmd == "ucinewgame") {
			ttable.clear();
			uci_pos.clear();
		}
		else if (cmd == "uci") {
			ttable.clear();
			uci_pos.clear();
			std::cout << "id name haVoc" << std::endl;
			std::cout << "id author M.Glatzmaier" << std::endl;
			std::cout << "option name Threads type spin default 1 min 1 max 1024" << std::endl;
			std::cout << "option name Hash type spin default 1024 min 1 max 33554432" << std::endl;
			std::cout << "option name MultiPV type spin default 1 min 1 max 4" << std::endl;
			std::cout << "uciok" << std::endl;
		}

		else if (cmd == "exit" || cmd == "quit") {
			running = false;
			break;
		}
		else std::cout << "unknown command: " << cmd << std::endl;

	}
	return running;
}